

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prov_custom_hsm.c
# Opt level: O1

int prov_custom_hsm_get_endorsement_key(HSM_CLIENT_HANDLE handle,uchar **key,size_t *key_len)

{
  size_t __size;
  int iVar1;
  uchar *__dest;
  CUSTOM_HSM_SAMPLE_INFO *hsm_info;
  
  if ((key == (uchar **)0x0 || handle == (HSM_CLIENT_HANDLE)0x0) || key_len == (size_t *)0x0) {
    printf("Invalid parameter specified");
    iVar1 = 0xba;
  }
  else {
    __size = *(size_t *)((long)handle + 0x20);
    __dest = (uchar *)malloc(__size);
    *key = __dest;
    if (__dest == (uchar *)0x0) {
      puts("Failure allocating endorsement key\r");
      iVar1 = 0xc4;
    }
    else {
      memcpy(__dest,*(void **)((long)handle + 0x18),__size);
      *key_len = __size;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int prov_custom_hsm_get_endorsement_key(HSM_CLIENT_HANDLE handle, unsigned char** key, size_t* key_len)
{
    int result;
    if (handle == NULL || key == NULL || key_len == NULL)
    {
        (void)printf("Invalid parameter specified");
        result = __LINE__;
    }
    else
    {
        // TODO: Retrieve the endorsement key and malloc the value and return
        // it to the sdk
        CUSTOM_HSM_SAMPLE_INFO* hsm_info = (CUSTOM_HSM_SAMPLE_INFO*)handle;
        if ((*key = (unsigned char*)malloc(hsm_info->ek_length)) == NULL)
        {
            (void)printf("Failure allocating endorsement key\r\n");
            result = __LINE__;
        }
        else
        {
            memcpy(*key, hsm_info->endorsment_key, hsm_info->ek_length);
            *key_len = hsm_info->ek_length;
            result = 0;
        }
    }
    return result;
}